

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O2

void __thiscall
diy::stats::DurationAccumulator::output(DurationAccumulator *this,ostream *out,string *prefix)

{
  ostream *poVar1;
  __node_base *p_Var2;
  
  if (prefix->_M_string_length != 0) {
    std::__cxx11::string::append((char *)prefix);
  }
  p_Var2 = &(this->duration)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    poVar1 = std::operator<<(out,(string *)prefix);
    poVar1 = operator<<(poVar1,(duration *)(p_Var2 + 5));
    poVar1 = std::operator<<(poVar1,' ');
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    std::operator<<(poVar1,'\n');
  }
  return;
}

Assistant:

void    output(std::ostream& out, std::string prefix = "") const
    {
        if (!prefix.empty())
            prefix += " ";

        for (auto& x : duration)
            out << prefix << x.second << ' ' << x.first << '\n';
    }